

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_cache.cc
# Opt level: O2

void __thiscall StorageCache::Close(StorageCache *this)

{
  _Base_ptr p_Var1;
  pair<long_long,_std::shared_ptr<StorageClient>_> element;
  pair<long_long,_std::shared_ptr<StorageClient>_> pStack_38;
  
  for (p_Var1 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::pair<long_long,_std::shared_ptr<StorageClient>_>::
    pair<const_long_long,_std::shared_ptr<StorageClient>,_true>
              (&pStack_38,(pair<const_long_long,_std::shared_ptr<StorageClient>_> *)(p_Var1 + 1));
    (*(pStack_38.second.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_StorageClient[1])();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pStack_38.second.super___shared_ptr<StorageClient,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void StorageCache::Close() {
  for (std::pair<long long, shared_ptr<StorageClient>> element : cache_) {
    element.second->Close();
  }
}